

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O3

UnicodeSet * __thiscall icu_63::UnicodeSet::add(UnicodeSet *this,UnicodeString *s)

{
  short sVar1;
  int iVar2;
  int32_t iVar3;
  
  sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar2 = (s->fUnion).fFields.fLength;
  }
  else {
    iVar2 = (int)sVar1 >> 5;
  }
  if (((iVar2 != 0) &&
      (this->stringSpan == (UnicodeSetStringSpan *)0x0 && this->bmpSet == (BMPSet *)0x0)) &&
     ((this->fFlags & 1) == 0)) {
    iVar3 = getSingleCP(s);
    if (iVar3 < 0) {
      iVar3 = UVector::indexOf(this->strings,s,0);
      if (iVar3 < 0) {
        _add(this,s);
        if (this->pat != (char16_t *)0x0) {
          uprv_free_63(this->pat);
          this->pat = (char16_t *)0x0;
          this->patLen = 0;
        }
      }
    }
    else {
      add(this,iVar3);
    }
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::add(const UnicodeString& s) {
    if (s.length() == 0 || isFrozen() || isBogus()) return *this;
    int32_t cp = getSingleCP(s);
    if (cp < 0) {
        if (!strings->contains((void*) &s)) {
            _add(s);
            releasePattern();
        }
    } else {
        add((UChar32)cp);
    }
    return *this;
}